

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

void mmu_handle_skey(uc_struct *uc,target_ulong addr,int rw,int *flags)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  byte local_29;
  
  lVar1 = uc[2].jmp_bufs[0x1d][0].__jmpbuf[6];
  plVar3 = uc[2].jmp_bufs[0x1d][0].__jmpbuf + 3;
  iVar2 = (**(code **)(lVar1 + 8))(plVar3,addr >> 0xc,1,&local_29);
  if (iVar2 != 0) {
    return;
  }
  if (rw != 2) {
    if (rw == 1) {
      local_29 = local_29 | 2;
      goto LAB_00cb9e35;
    }
    if (rw != 0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/mmu_helper.c"
                 ,0x153,(char *)0x0);
    }
  }
  if ((local_29 & 2) == 0) {
    *(byte *)flags = (byte)*flags & 0xfd;
  }
LAB_00cb9e35:
  local_29 = local_29 | 4;
  (**(code **)(lVar1 + 0x10))(plVar3,addr >> 0xc,1);
  return;
}

Assistant:

static void mmu_handle_skey(uc_engine *uc, target_ulong addr, int rw, int *flags)
{ 
    S390SKeysState *ss = (S390SKeysState *)(&((S390CPU *)uc->cpu)->ss);
    S390SKeysClass *skeyclass = S390_SKEYS_GET_CLASS(ss);
    uint8_t key;
    int rc;

#if 0
    if (unlikely(addr >= ram_size)) {
        return;
    }
#endif

    /*
     * Whenever we create a new TLB entry, we set the storage key reference
     * bit. In case we allow write accesses, we set the storage key change
     * bit. Whenever the guest changes the storage key, we have to flush the
     * TLBs of all CPUs (the whole TLB or all affected entries), so that the
     * next reference/change will result in an MMU fault and make us properly
     * update the storage key here.
     *
     * Note 1: "record of references ... is not necessarily accurate",
     *         "change bit may be set in case no storing has occurred".
     *         -> We can set reference/change bits even on exceptions.
     * Note 2: certain accesses seem to ignore storage keys. For example,
     *         DAT translation does not set reference bits for table accesses.
     *
     * TODO: key-controlled protection. Only CPU accesses make use of the
     *       PSW key. CSS accesses are different - we have to pass in the key.
     *
     * TODO: we have races between getting and setting the key.
     */
    rc = skeyclass->get_skeys(ss, addr / TARGET_PAGE_SIZE, 1, &key);
    if (rc) {
        // trace_get_skeys_nonzero(rc);
        return;
    }

    switch (rw) {
    case MMU_DATA_LOAD:
    case MMU_INST_FETCH:
        /*
         * The TLB entry has to remain write-protected on read-faults if
         * the storage key does not indicate a change already. Otherwise
         * we might miss setting the change bit on write accesses.
         */
        if (!(key & SK_C)) {
            *flags &= ~PAGE_WRITE;
        }
        break;
    case MMU_DATA_STORE:
        key |= SK_C;
        break;
    default:
        g_assert_not_reached();
    }

    /* Any store/fetch sets the reference bit */
    key |= SK_R;

    rc = skeyclass->set_skeys(ss, addr / TARGET_PAGE_SIZE, 1, &key);
    if (rc) {
        // trace_set_skeys_nonzero(rc);
    }
}